

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_atexit.c
# Opt level: O1

int portability_atexit_register(portability_atexit_fn handler)

{
  atexit_node_type **ppaVar1;
  atexit_node_type *paVar2;
  atexit_node_type *paVar3;
  int iVar4;
  
  paVar2 = atexit_list;
  iVar4 = 1;
  if (atexit_list != (atexit_node_type *)0x0) {
    paVar3 = atexit_list;
    if (atexit_list->handler == (portability_atexit_fn)0x0) {
      atexit_list->handler = handler;
    }
    else {
      do {
        if (paVar3->handler == handler) {
          return 1;
        }
        ppaVar1 = &paVar3->next;
        paVar3 = *ppaVar1;
      } while (*ppaVar1 != (atexit_node_type *)0x0);
      paVar3 = (atexit_node_type *)malloc(0x10);
      if (paVar3 == (atexit_node_type *)0x0) {
        return 1;
      }
      paVar3->handler = handler;
      paVar3->next = paVar2;
      atexit_list = paVar3;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int portability_atexit_register(portability_atexit_fn handler)
{
	if (atexit_list == NULL)
	{
		return 1;
	}

	if (atexit_list->handler == NULL)
	{
		atexit_list->handler = handler;
	}
	else
	{
		struct atexit_node_type *iterator = atexit_list;

		/* Find the last or duplicates */
		for (;;)
		{
			if (iterator->handler == handler)
			{
				/* Already registered, skip */
				return 1;
			}

			if (iterator->next == NULL)
			{
				break;
			}

			iterator = iterator->next;
		}

		/* Allocate the new node */
		struct atexit_node_type *node = malloc(sizeof(struct atexit_node_type));

		if (node == NULL)
		{
			return 1;
		}

		node->handler = handler;
		node->next = atexit_list;

		/* Insert it at the begining */
		atexit_list = node;
	}

	return 0;
}